

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

int dsListDel(dsList *list,void *data)

{
  int iVar1;
  uint64_t uVar2;
  dsListEntry *entry;
  void *pvVar3;
  void *pvVar4;
  char *fmt;
  
  uVar2 = dsOffset(data);
  entry = dsListBegin(list);
  while( true ) {
    if (entry == (dsListEntry *)0x0) {
      return 1;
    }
    if (entry->dataOffset == uVar2) break;
    entry = dsListNext(entry);
  }
  if (entry->prevOffset == 0xffffffffffffffff) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = dsPtr(entry->prevOffset,0x20);
    if (pvVar3 == (void *)0x0) {
      fmt = "%s(): Can\'t map list previous offset.\n";
      goto LAB_00103a26;
    }
  }
  if (entry->nextOffset == 0xffffffffffffffff) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = dsPtr(entry->nextOffset,0x20);
    if (pvVar4 == (void *)0x0) {
      fmt = "%s(): Can\'t map list next offset.\n";
      goto LAB_00103a26;
    }
  }
  if (pvVar3 != (void *)0x0) {
    *(uint64_t *)((long)pvVar3 + 0x10) = entry->nextOffset;
  }
  if (pvVar4 != (void *)0x0) {
    *(uint64_t *)((long)pvVar4 + 8) = entry->prevOffset;
  }
  uVar2 = dsOffset(entry);
  if (uVar2 == list->headOffset) {
    list->headOffset = entry->nextOffset;
  }
  list->count = list->count - 1;
  iVar1 = dsFree(entry);
  if (-1 < iVar1) {
    return 0;
  }
  fmt = "%s(): Can\'t free list entry object.\n";
LAB_00103a26:
  dsRunLogCallback(fmt,"dsListDel");
  return -1;
}

Assistant:

int
dsListDel(dsList *list, void *data)
{
	dsListEntry *entry;
	uint64_t dataOffset;
	uint64_t listEntryOffset;

	dataOffset = dsOffset(data);

	for (entry = dsListBegin(list);
		 entry != NULL;
		 entry = dsListNext(entry)) {

		if (entry->dataOffset == dataOffset) {
			dsListEntry *prev = NULL;
			dsListEntry *next = NULL;

			/*
			 * Found the entry to remove.
			 */
			if (entry->prevOffset != UINT64_MAX) {
				if ((prev = dsPtr(entry->prevOffset,
								sizeof(*entry))) == NULL) {
					dsLog("Can't map list previous offset.\n");
					return(-1);
				}
			}
			if (entry->nextOffset != UINT64_MAX) {
				if ((next = dsPtr(entry->nextOffset,
								sizeof(*entry))) == NULL) {
					dsLog("Can't map list next offset.\n");
					return(-1);
				}
			}

			/*
			 * Unlink after mapping all neighbors.
			 */
			if (prev != NULL) {
				prev->nextOffset = entry->nextOffset;
			}
			if (next != NULL) {
				next->prevOffset = entry->prevOffset;
			}

			listEntryOffset = dsOffset(entry);
			if (listEntryOffset == list->headOffset) {
				/*
				 * This was the first list entry.
				 */
				list->headOffset = entry->nextOffset;
			}

			list->count--;

			if (dsFree(entry) < 0) {
				dsLog("Can't free list entry object.\n");
				return(-1);
			}

			return(0);
		}
	}

	return(1);
}